

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

char * leveldb::DecodeEntry
                 (char *p,char *limit,uint32_t *shared,uint32_t *non_shared,uint32_t *value_length)

{
  char *pcVar1;
  uint *in_RCX;
  uint *in_RDX;
  long in_RSI;
  byte *in_RDI;
  uint *in_R8;
  uint32_t *in_stack_ffffffffffffffc8;
  byte *local_10;
  byte *local_8;
  
  if (in_RSI - (long)in_RDI < 3) {
    return (char *)0x0;
  }
  *in_RDX = (uint)*in_RDI;
  *in_RCX = (uint)in_RDI[1];
  *in_R8 = (uint)in_RDI[2];
  if ((*in_RDX | *in_RCX | *in_R8) < 0x80) {
    local_10 = in_RDI + 3;
  }
  else {
    pcVar1 = GetVarint32Ptr((char *)in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar1 = GetVarint32Ptr((char *)in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8);
    if (pcVar1 == (char *)0x0) {
      return (char *)0x0;
    }
    local_10 = (byte *)GetVarint32Ptr((char *)in_RCX,(char *)in_R8,in_stack_ffffffffffffffc8);
    if (local_10 == (byte *)0x0) {
      return (char *)0x0;
    }
  }
  if ((uint)((int)in_RSI - (int)local_10) < *in_RCX + *in_R8) {
    local_8 = (byte *)0x0;
  }
  else {
    local_8 = local_10;
  }
  return (char *)local_8;
}

Assistant:

static inline const char* DecodeEntry(const char* p, const char* limit,
                                      uint32_t* shared, uint32_t* non_shared,
                                      uint32_t* value_length) {
  if (limit - p < 3) return nullptr;
  *shared = reinterpret_cast<const uint8_t*>(p)[0];
  *non_shared = reinterpret_cast<const uint8_t*>(p)[1];
  *value_length = reinterpret_cast<const uint8_t*>(p)[2];
  if ((*shared | *non_shared | *value_length) < 128) {
    // Fast path: all three values are encoded in one byte each
    p += 3;
  } else {
    if ((p = GetVarint32Ptr(p, limit, shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, non_shared)) == nullptr) return nullptr;
    if ((p = GetVarint32Ptr(p, limit, value_length)) == nullptr) return nullptr;
  }

  if (static_cast<uint32_t>(limit - p) < (*non_shared + *value_length)) {
    return nullptr;
  }
  return p;
}